

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseMemidx(WastParser *this,Location loc,Var *out_memidx)

{
  Var *out_var;
  bool bVar1;
  byte local_c9;
  Var local_98;
  Enum local_50;
  Enum local_4c;
  Enum local_48;
  Enum local_44;
  size_t local_40;
  char *local_38;
  size_t local_30;
  undefined8 local_28;
  Var *local_20;
  Var *out_memidx_local;
  WastParser *this_local;
  
  local_20 = out_memidx;
  out_memidx_local = (Var *)this;
  bVar1 = PeekMatchLpar(this,Memory);
  out_var = local_20;
  if (bVar1) {
    bVar1 = Features::multi_memory_enabled(&this->options_->features);
    if (!bVar1) {
      local_40 = loc.filename._M_len;
      local_38 = loc.filename._M_str;
      local_30 = (size_t)loc.field_1.field_1.offset;
      local_28 = loc.field_1._8_8_;
      Error(this,0x31c611);
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    local_44 = (Enum)Expect(this,Lpar);
    bVar1 = Failed((Result)local_44);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    local_48 = (Enum)Expect(this,Memory);
    bVar1 = Failed((Result)local_48);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    local_4c = (Enum)ParseVar(this,local_20);
    bVar1 = Failed((Result)local_4c);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    local_50 = (Enum)Expect(this,Rpar);
    bVar1 = Failed((Result)local_50);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
  }
  else {
    Var::Var(&local_98,0,&loc);
    bVar1 = ParseVarOpt(this,out_var,&local_98);
    local_c9 = 0;
    if (bVar1) {
      bVar1 = Features::multi_memory_enabled(&this->options_->features);
      local_c9 = bVar1 ^ 0xff;
    }
    Var::~Var(&local_98);
    if ((local_c9 & 1) != 0) {
      Error(this,0x31c611);
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
  }
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseMemidx(Location loc, Var* out_memidx) {
  WABT_TRACE(ParseMemidx);
  if (PeekMatchLpar(TokenType::Memory)) {
    if (!options_->features.multi_memory_enabled()) {
      Error(loc, "Specifying memory variable is not allowed");
      return Result::Error;
    }
    EXPECT(Lpar);
    EXPECT(Memory);
    CHECK_RESULT(ParseVar(out_memidx));
    EXPECT(Rpar);
  } else {
    if (ParseVarOpt(out_memidx, Var(0, loc)) &&
        !options_->features.multi_memory_enabled()) {
      Error(loc, "Specifying memory variable is not allowed");
      return Result::Error;
    }
  }
  return Result::Ok;
}